

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_generator.cc
# Opt level: O1

bool __thiscall re2::StringGenerator::RandomDigits(StringGenerator *this)

{
  int iVar1;
  uint uVar2;
  int32 iVar3;
  ulong uVar4;
  
  iVar1 = this->nrandom_;
  this->nrandom_ = iVar1 + -1;
  if (1 < iVar1) {
    uVar2 = ACMRandom::Uniform(this->acm_,this->maxlen_ + 1);
    std::vector<int,_std::allocator<int>_>::resize(&this->digits_,(long)(int)uVar2);
    if (0 < (int)uVar2) {
      uVar4 = 0;
      do {
        iVar3 = ACMRandom::Uniform(this->acm_,
                                   (int32)((ulong)((long)(this->alphabet_).
                                                                                                                  
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(this->alphabet_).
                                                                                                                
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 5));
        (this->digits_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar4] = iVar3;
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
    }
  }
  return 1 < iVar1;
}

Assistant:

bool StringGenerator::RandomDigits() {
  if (--nrandom_ <= 0)
    return false;

  // Pick length.
  int len = acm_->Uniform(maxlen_+1);
  digits_.resize(len);
  for (int i = 0; i < len; i++)
    digits_[i] = acm_->Uniform(static_cast<int32>(alphabet_.size()));
  return true;
}